

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doh.c
# Opt level: O1

void doh_probe_done(Curl_easy *data,Curl_easy *doh,CURLcode result)

{
  doh_probes *pdVar1;
  curl_trc_feat *pcVar2;
  bool bVar3;
  bool bVar4;
  void *pvVar5;
  char *pcVar6;
  size_t len;
  int iVar7;
  ulong uVar8;
  dynbuf *s;
  
  pdVar1 = (data->state).async.doh;
  if (pdVar1 != (doh_probes *)0x0) {
    pvVar5 = Curl_meta_get(doh,"ezm:doh-p");
    if (pdVar1->probe_resp[0].probe_mid == doh->mid) {
      bVar3 = true;
      iVar7 = 0;
    }
    else {
      bVar4 = true;
      do {
        bVar3 = bVar4;
        if (!bVar3) goto LAB_0012527f;
        bVar4 = false;
      } while (pdVar1->probe_resp[1].probe_mid != doh->mid);
      iVar7 = 1;
    }
    if (!bVar3) {
LAB_0012527f:
      Curl_failf(data,"unknown sub request done");
      return;
    }
    pdVar1->pending = pdVar1->pending - 1;
    if (((doh != (Curl_easy *)0x0) && (((doh->set).field_0x89f & 0x40) != 0)) &&
       ((pcVar2 = (doh->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)))) {
      Curl_infof(doh,"a DoH request is completed, %u to go");
    }
    uVar8 = (ulong)(uint)(iVar7 * 0x30);
    *(CURLcode *)((long)&pdVar1->probe_resp[0].result + uVar8) = result;
    if (pvVar5 != (void *)0x0) {
      if (result == CURLE_OK) {
        *(undefined4 *)((long)&pdVar1->probe_resp[0].dnstype + uVar8) =
             *(undefined4 *)((long)pvVar5 + 0x140);
        s = (dynbuf *)((long)pvVar5 + 0x118);
        pcVar6 = Curl_dyn_ptr(s);
        len = Curl_dyn_len(s);
        result = Curl_dyn_addn((dynbuf *)((long)&pdVar1->probe_resp[0].body.bufr + uVar8),pcVar6,len
                              );
        Curl_dyn_free(s);
      }
      Curl_meta_remove(doh,"ezm:doh-p");
    }
    if ((((doh != (Curl_easy *)0x0) && (result != CURLE_OK)) &&
        (((doh->set).field_0x89f & 0x40) != 0)) &&
       ((pcVar2 = (doh->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)))) {
      pcVar6 = curl_easy_strerror(result);
      Curl_infof(doh,"DoH request %s",pcVar6);
    }
    if (pdVar1->pending == 0) {
      Curl_expire(data,0,EXPIRE_RUN_NOW);
      return;
    }
  }
  return;
}

Assistant:

static void doh_probe_done(struct Curl_easy *data,
                           struct Curl_easy *doh, CURLcode result)
{
  struct doh_probes *dohp = data->state.async.doh;
  DEBUGASSERT(dohp);
  if(dohp) {
    struct doh_request *doh_req = Curl_meta_get(doh, CURL_EZM_DOH_PROBE);
    int i;

    for(i = 0; i < DOH_SLOT_COUNT; ++i) {
      if(dohp->probe_resp[i].probe_mid == doh->mid)
        break;
    }
    if(i >= DOH_SLOT_COUNT) {
      failf(data, "unknown sub request done");
      return;
    }

    dohp->pending--;
    infof(doh, "a DoH request is completed, %u to go", dohp->pending);
    dohp->probe_resp[i].result = result;
    /* We expect either the meta data still to exist or the sub request
     * to have already failed. */
    DEBUGASSERT(doh_req || result);
    if(doh_req) {
      if(!result) {
        dohp->probe_resp[i].dnstype = doh_req->dnstype;
        result = Curl_dyn_addn(&dohp->probe_resp[i].body,
                               Curl_dyn_ptr(&doh_req->resp_body),
                               Curl_dyn_len(&doh_req->resp_body));
        Curl_dyn_free(&doh_req->resp_body);
      }
      Curl_meta_remove(doh, CURL_EZM_DOH_PROBE);
    }

    if(result)
      infof(doh, "DoH request %s", curl_easy_strerror(result));

    if(!dohp->pending) {
      /* DoH completed, run the transfer picking up the results */
      Curl_expire(data, 0, EXPIRE_RUN_NOW);
    }
  }
}